

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Def.cpp
# Opt level: O2

void __thiscall hdc::Def::addParameter(Def *this,Token *name,Type *type)

{
  int value;
  Variable *this_00;
  Parameter *param;
  
  this_00 = (Variable *)operator_new(0x68);
  Parameter::Parameter((Parameter *)this_00,name,type);
  value = this->localVarNameCounter;
  this->localVarNameCounter = value + 1;
  param = (Parameter *)this_00;
  Variable::setLocalName(this_00,value);
  std::vector<hdc::Parameter_*,_std::allocator<hdc::Parameter_*>_>::push_back
            (&this->parameters,&param);
  return;
}

Assistant:

void Def::addParameter(hdc::Token& name, Type* type) {
    Parameter* param;

    param = new Parameter(name, type);
    param->setLocalName(localVarNameCounter++);
    parameters.push_back(param);
}